

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O0

pboolean pp_shm_create_handle(PShm *shm,PError **error)

{
  pint pVar1;
  PErrorIPC PVar2;
  int iVar3;
  void *pvVar4;
  PSemaphore *pPVar5;
  bool bVar6;
  bool bVar7;
  undefined1 local_c0 [8];
  stat stat_buf;
  int local_28;
  pint flags;
  pint fd;
  pboolean is_exists;
  PError **error_local;
  PShm *shm_local;
  
  bVar6 = true;
  if (shm != (PShm *)0x0) {
    bVar6 = shm->platform_key == (pchar *)0x0;
  }
  if (bVar6) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    shm_local._4_4_ = 0;
  }
  else {
    bVar6 = false;
    do {
      local_28 = shm_open(shm->platform_key,0xc2,0x1b0);
      bVar7 = false;
      if (local_28 == -1) {
        pVar1 = p_error_get_last_system();
        bVar7 = pVar1 == 4;
      }
    } while (bVar7);
    if (local_28 == -1) {
      pVar1 = p_error_get_last_system();
      if (pVar1 == 0x11) {
        bVar6 = true;
        do {
          local_28 = shm_open(shm->platform_key,2,0x1b0);
          bVar7 = false;
          if (local_28 == -1) {
            pVar1 = p_error_get_last_system();
            bVar7 = pVar1 == 4;
          }
        } while (bVar7);
      }
    }
    else {
      shm->shm_created = 1;
    }
    if (local_28 == -1) {
      PVar2 = p_error_get_last_ipc();
      pVar1 = p_error_get_last_system();
      p_error_set_error_p(error,PVar2,pVar1,"Failed to call shm_open() to create memory segment");
      pp_shm_clean_handle(shm);
      shm_local._4_4_ = 0;
    }
    else {
      if (bVar6) {
        iVar3 = fstat(local_28,(stat *)local_c0);
        if (iVar3 == -1) {
          PVar2 = p_error_get_last_ipc();
          pVar1 = p_error_get_last_system();
          p_error_set_error_p(error,PVar2,pVar1,"Failed to call fstat() to get memory segment size")
          ;
          pVar1 = p_sys_close(local_28);
          if (pVar1 != 0) {
            printf("** Warning: %s **\n","PShm::pp_shm_create_handle: p_sys_close() failed(1)");
          }
          pp_shm_clean_handle(shm);
          return 0;
        }
        shm->size = stat_buf.st_rdev;
      }
      else {
        iVar3 = ftruncate(local_28,shm->size);
        if (iVar3 == -1) {
          PVar2 = p_error_get_last_ipc();
          pVar1 = p_error_get_last_system();
          p_error_set_error_p(error,PVar2,pVar1,
                              "Failed to call ftruncate() to set memory segment size");
          pVar1 = p_sys_close(local_28);
          if (pVar1 != 0) {
            printf("** Warning: %s **\n","PShm::pp_shm_create_handle: p_sys_close() failed(2)");
          }
          pp_shm_clean_handle(shm);
          return 0;
        }
      }
      stat_buf.__glibc_reserved[2]._4_4_ = 3;
      if (shm->perms == P_SHM_ACCESS_READONLY) {
        stat_buf.__glibc_reserved[2]._4_4_ = 1;
      }
      pvVar4 = mmap((void *)0x0,shm->size,stat_buf.__glibc_reserved[2]._4_4_,1,local_28,0);
      shm->addr = pvVar4;
      if (pvVar4 == (void *)0xffffffffffffffff) {
        PVar2 = p_error_get_last_ipc();
        pVar1 = p_error_get_last_system();
        p_error_set_error_p(error,PVar2,pVar1,"Failed to call mmap() to map memory segment");
        shm->addr = (ppointer)0x0;
        pVar1 = p_sys_close(local_28);
        if (pVar1 != 0) {
          printf("** Warning: %s **\n","PShm::pp_shm_create_handle: p_sys_close() failed(3)");
        }
        pp_shm_clean_handle(shm);
        shm_local._4_4_ = 0;
      }
      else {
        pVar1 = p_sys_close(local_28);
        if (pVar1 != 0) {
          printf("** Warning: %s **\n","PShm::pp_shm_create_handle: p_sys_close() failed(4)");
        }
        pPVar5 = p_semaphore_new(shm->platform_key,1,(uint)!bVar6,error);
        shm->sem = pPVar5;
        if (pPVar5 == (PSemaphore *)0x0) {
          pp_shm_clean_handle(shm);
          shm_local._4_4_ = 0;
        }
        else {
          shm_local._4_4_ = 1;
        }
      }
    }
  }
  return shm_local._4_4_;
}

Assistant:

static pboolean
pp_shm_create_handle (PShm	*shm,
		      PError	**error)
{
	pboolean	is_exists;
	pint		fd;
	pint		flags;
	struct stat	stat_buf;

	if (P_UNLIKELY (shm == NULL || shm->platform_key == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	is_exists = FALSE;

	while ((fd = shm_open (shm->platform_key,
			       O_CREAT | O_EXCL | O_RDWR,
			       0660)) == P_SHM_INVALID_HDL &&
	       p_error_get_last_system () == EINTR)
		;

	if (fd == P_SHM_INVALID_HDL) {
		if (p_error_get_last_system () == EEXIST) {
			is_exists = TRUE;

			while ((fd = shm_open (shm->platform_key,
					       O_RDWR,
					       0660)) == P_SHM_INVALID_HDL &&
			       p_error_get_last_system () == EINTR)
				;
		}
	} else
		shm->shm_created = TRUE;

	if (P_UNLIKELY (fd == P_SHM_INVALID_HDL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call shm_open() to create memory segment");
		pp_shm_clean_handle (shm);
		return FALSE;
	}

	/* Try to get size of the existing file descriptor */
	if (is_exists) {
		if (P_UNLIKELY (fstat (fd, &stat_buf) == -1)) {
			p_error_set_error_p (error,
					     (pint) p_error_get_last_ipc (),
					     p_error_get_last_system (),
					     "Failed to call fstat() to get memory segment size");

			if (P_UNLIKELY (p_sys_close (fd) != 0))
				P_WARNING ("PShm::pp_shm_create_handle: p_sys_close() failed(1)");

			pp_shm_clean_handle (shm);
			return FALSE;
		}

		shm->size = (psize) stat_buf.st_size;
	} else {
		if (P_UNLIKELY ((ftruncate (fd, (off_t) shm->size)) == -1)) {
			p_error_set_error_p (error,
					     (pint) p_error_get_last_ipc (),
					     p_error_get_last_system (),
					     "Failed to call ftruncate() to set memory segment size");

			if (P_UNLIKELY (p_sys_close (fd) != 0))
				P_WARNING ("PShm::pp_shm_create_handle: p_sys_close() failed(2)");

			pp_shm_clean_handle (shm);
			return FALSE;
		}
	}

	flags = (shm->perms == P_SHM_ACCESS_READONLY) ? PROT_READ : PROT_READ | PROT_WRITE;

	if (P_UNLIKELY ((shm->addr = mmap (NULL, shm->size, flags, MAP_SHARED, fd, 0)) == (void *) -1)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call mmap() to map memory segment");
		shm->addr = NULL;

		if (P_UNLIKELY (p_sys_close (fd) != 0))
			P_WARNING ("PShm::pp_shm_create_handle: p_sys_close() failed(3)");

		pp_shm_clean_handle (shm);
		return FALSE;
	}

	if (P_UNLIKELY (p_sys_close (fd) != 0))
		P_WARNING ("PShm::pp_shm_create_handle: p_sys_close() failed(4)");

	if (P_UNLIKELY ((shm->sem = p_semaphore_new (shm->platform_key, 1,
						     is_exists ? P_SEM_ACCESS_OPEN : P_SEM_ACCESS_CREATE,
						     error)) == NULL)) {
		pp_shm_clean_handle (shm);
		return FALSE;
	}

	return TRUE;
}